

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint128_c_t
weak_farmhash_na_len_32_with_seeds_vals
          (uint64_t w,uint64_t x,uint64_t y,uint64_t z,uint64_t a,uint64_t b)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t val;
  uint64_t uVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  uint128_c_t uVar4;
  uint64_t c;
  
  lVar1 = in_R8 + in_RDI;
  uVar2 = ror64(in_R9 + lVar1 + in_RCX,0x15);
  val = lVar1 + in_RSI + in_RDX;
  uVar3 = ror64(val,0x2c);
  uVar4 = make_uint128_c_t(val + in_RCX,uVar2 + uVar3 + lVar1);
  return uVar4;
}

Assistant:

static inline uint128_c_t weak_farmhash_na_len_32_with_seeds_vals(
    uint64_t w, uint64_t x, uint64_t y, uint64_t z, uint64_t a, uint64_t b) {
  a += w;
  b = ror64(b + a + z, 21);
  uint64_t c = a;
  a += x;
  a += y;
  b += ror64(a, 44);
  return make_uint128_c_t(a + z, b + c);
}